

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall
amrex::MLMG::apply(MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *out,
                  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_in)

{
  long *plVar1;
  MultiFab *pMVar2;
  MultiFab *pMVar3;
  undefined8 uVar4;
  _Atomic_word _Var5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int scomp;
  MultiFab **ppMVar10;
  MultiFab *pMVar11;
  BoxArray *pBVar12;
  DistributionMapping *pDVar13;
  FabArrayBase *this_00;
  MultiFab *pMVar14;
  MultiFab *pMVar15;
  long in_RDI;
  IntVect IVar16;
  int alev_3;
  MultiFab *crse_bcdata;
  int alev_2;
  Vector<int,_std::allocator<int>_> *amrrr;
  Any a;
  int alev_1;
  IntVect ng;
  int alev;
  IntVect ng_sol;
  int nghost;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> rh;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> in_raii;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> in;
  MultiFab *in_stack_fffffffffffffb48;
  MLLinOp *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  MultiFab *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  MultiFab *in_stack_fffffffffffffb78;
  MultiFab *pMVar17;
  MultiFab *in_stack_fffffffffffffb80;
  MultiFab *pMVar18;
  MultiFab *local_420;
  int local_334;
  int local_324;
  undefined1 local_198 [12];
  int local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  _func_int **local_128;
  int local_120;
  _func_int **local_11c;
  int local_114;
  int local_110 [3];
  undefined8 local_fc;
  int local_f4;
  int local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_ec;
  undefined1 local_d8 [132];
  int local_54;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Bit_type *local_40;
  undefined4 local_34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined4 local_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  int local_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x125e161);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48,
             (allocator_type *)0x125e17e);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x125e18d);
  std::allocator<amrex::MultiFab>::allocator((allocator<amrex::MultiFab> *)0x125e1b6);
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)in_stack_fffffffffffffb50,
             (size_type)in_stack_fffffffffffffb48,(allocator_type *)0x125e1d3);
  std::allocator<amrex::MultiFab>::~allocator((allocator<amrex::MultiFab> *)0x125e1e2);
  std::allocator<amrex::MultiFab>::allocator((allocator<amrex::MultiFab> *)0x125e20b);
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)in_stack_fffffffffffffb50,
             (size_type)in_stack_fffffffffffffb48,(allocator_type *)0x125e228);
  std::allocator<amrex::MultiFab>::~allocator((allocator<amrex::MultiFab> *)0x125e237);
  local_ec._M_weak_count = 0;
  IntVect::IntVect((IntVect *)&local_ec,1);
  bVar6 = MLLinOp::hasHiddenDimension((MLLinOp *)0x125e265);
  if (bVar6) {
    iVar8 = MLLinOp::hiddenDirection(*(MLLinOp **)(in_RDI + 0x48));
    *(undefined4 *)((long)&local_ec._vptr__Sp_counted_base + (long)iVar8 * 4) = 0;
    local_54 = iVar8;
    local_50 = &local_ec;
  }
  for (local_f0 = 0; local_f0 < *(int *)(in_RDI + 0x50); local_f0 = local_f0 + 1) {
    if (*(int *)(in_RDI + 0x24) == 1) {
      local_ec._M_weak_count =
           (**(code **)(**(long **)(in_RDI + 0x48) + 0x30))(*(long **)(in_RDI + 0x48),local_f0,0);
      ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      pMVar11 = *ppMVar10;
      ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      *ppMVar10 = pMVar11;
    }
    else {
      ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      IVar16 = FabArrayBase::nGrowVect((FabArrayBase *)*ppMVar10);
      local_110._0_8_ = IVar16.vect._0_8_;
      local_fc._0_4_ = local_110[0];
      local_fc._4_4_ = local_110[1];
      uVar4 = local_fc;
      local_110[2] = IVar16.vect[2];
      local_f4 = local_110[2];
      local_40 = &local_fc;
      local_48 = &local_ec;
      local_fc._0_4_ = IVar16.vect[0];
      local_14 = 0;
      bVar6 = false;
      if ((int)local_fc == (int)local_ec._vptr__Sp_counted_base) {
        local_fc._4_4_ = IVar16.vect[1];
        local_24 = 1;
        bVar6 = false;
        local_20 = local_48;
        if (local_fc._4_4_ == local_ec._vptr__Sp_counted_base._4_4_) {
          local_34 = 2;
          bVar6 = local_110[2] == local_ec._M_use_count;
          local_30 = local_48;
        }
      }
      local_110 = IVar16.vect;
      local_fc = uVar4;
      local_10 = local_48;
      if (bVar6) {
        ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                             ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        pMVar11 = *ppMVar10;
        ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                             ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        *ppMVar10 = pMVar11;
      }
      else {
        local_11c = local_ec._vptr__Sp_counted_base;
        local_114 = local_ec._M_use_count;
        if (*(int *)(in_RDI + 0x24) == 1) {
          IntVect::IntVect((IntVect *)&local_128,local_ec._M_weak_count);
          local_11c = local_128;
          local_114 = local_120;
        }
        pMVar11 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                             in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                             ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        pBVar12 = FabArrayBase::boxArray((FabArrayBase *)*ppMVar10);
        ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                             ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        pDVar13 = FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar10);
        ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                             ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        uVar9 = FabArrayBase::nComp((FabArrayBase *)*ppMVar10);
        local_148 = 0;
        uStack_140 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_138 = 0;
        MFInfo::MFInfo((MFInfo *)0x125e698);
        in_stack_fffffffffffffb48 =
             (MultiFab *)
             MLLinOp::Factory(in_stack_fffffffffffffb50,
                              (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                              (int)in_stack_fffffffffffffb48);
        (*(pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[3])
                  (pMVar11,pBVar12,pDVar13,(ulong)uVar9,&local_11c,&local_158);
        MFInfo::~MFInfo((MFInfo *)0x125e702);
        Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                  ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                   in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                             ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        FabArrayBase::nComp((FabArrayBase *)*ppMVar10);
        MultiFab::Copy(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb74
                       ,in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                       (int)in_stack_fffffffffffffb68);
        pMVar11 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                             in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                             ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        *ppMVar10 = pMVar11;
      }
    }
    pMVar11 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                        ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                         in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
    ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                         ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
    pBVar12 = FabArrayBase::boxArray((FabArrayBase *)*ppMVar10);
    ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                         ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
    pDVar13 = FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar10);
    ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                         ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
    uVar9 = FabArrayBase::nComp((FabArrayBase *)*ppMVar10);
    _Var5 = local_ec._M_weak_count;
    local_178 = 0;
    uStack_170 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_168 = 0;
    MFInfo::MFInfo((MFInfo *)0x125e8b6);
    in_stack_fffffffffffffb48 =
         (MultiFab *)
         MLLinOp::Factory(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                          (int)in_stack_fffffffffffffb48);
    (*(pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar11,pBVar12,pDVar13,(ulong)uVar9,(ulong)(uint)_Var5,&local_188);
    MFInfo::~MFInfo((MFInfo *)0x125e920);
    Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
              ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffb50,
               (value_type)in_stack_fffffffffffffb48);
  }
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    (**(code **)(**(long **)(in_RDI + 0x48) + 0xe8))();
    *(undefined1 *)(in_RDI + 0x58) = 1;
  }
  else {
    bVar7 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x38))();
    if ((bVar7 & 1) != 0) {
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x40))();
    }
  }
  for (local_18c = 0; local_18c < *(int *)(in_RDI + 0x50); local_18c = local_18c + 1) {
    Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
              ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
    this_00 = (FabArrayBase *)
              Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                        ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                         in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
    FabArrayBase::nComp(this_00);
    MultiFab::MultiFab(in_stack_fffffffffffffb60,
                       (MultiFab *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                       (MakeType)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                       (int)in_stack_fffffffffffffb50,
                       (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    Any::Any<amrex::MultiFab>
              ((Any *)in_stack_fffffffffffffb60,
               (MultiFab *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    MultiFab::~MultiFab((MultiFab *)0x125eaa3);
    (**(code **)(**(long **)(in_RDI + 0x48) + 0xc0))(*(long **)(in_RDI + 0x48),local_18c,local_198);
    Any::~Any((Any *)0x125ead9);
  }
  MLLinOp::AMRRefRatio(*(MLLinOp **)(in_RDI + 0x48));
  for (local_324 = *(int *)(in_RDI + 0x54); -1 < local_324; local_324 = local_324 + -1) {
    if (local_324 < 1) {
      local_420 = (MultiFab *)0x0;
      pMVar11 = in_stack_fffffffffffffb48;
    }
    else {
      ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      local_420 = *ppMVar10;
      pMVar11 = in_stack_fffffffffffffb48;
    }
    plVar1 = *(long **)(in_RDI + 0x48);
    ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                         ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          in_stack_fffffffffffffb50,(size_type)pMVar11);
    pMVar17 = *ppMVar10;
    ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                         ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          in_stack_fffffffffffffb50,(size_type)pMVar11);
    pMVar18 = *ppMVar10;
    pMVar14 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                        ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                         in_stack_fffffffffffffb50,(size_type)pMVar11);
    (**(code **)(*plVar1 + 0x80))(plVar1,local_324,pMVar17,pMVar18,pMVar14,local_420);
    in_stack_fffffffffffffb48 = pMVar11;
    if (local_324 < *(int *)(in_RDI + 0x54)) {
      plVar1 = *(long **)(in_RDI + 0x48);
      ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffffb50,(size_type)pMVar11);
      pMVar14 = *ppMVar10;
      pMVar17 = (MultiFab *)(local_d8 + 0x50);
      ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffffb50,(size_type)pMVar11);
      pMVar2 = *ppMVar10;
      pMVar18 = (MultiFab *)local_d8;
      pMVar15 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                          ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                           in_stack_fffffffffffffb50,(size_type)pMVar11);
      ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffffb50,(size_type)pMVar11);
      pMVar3 = *ppMVar10;
      ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffffb50,(size_type)pMVar11);
      in_stack_fffffffffffffb48 = *ppMVar10;
      in_stack_fffffffffffffb50 =
           (MLLinOp *)
           Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                     ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                      in_stack_fffffffffffffb50,(size_type)pMVar11);
      (**(code **)(*plVar1 + 0x90))(plVar1,local_324,pMVar14,pMVar2,pMVar15,pMVar3);
      bVar6 = MLLinOp::isCellCentered(*(MLLinOp **)(in_RDI + 0x48));
      if (bVar6) {
        Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                             ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        iVar8 = (int)((ulong)*ppMVar10 >> 0x20);
        ppMVar10 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                             ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        scomp = FabArrayBase::nComp((FabArrayBase *)*ppMVar10);
        Vector<int,_std::allocator<int>_>::operator[]
                  ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50,
                   (size_type)in_stack_fffffffffffffb48);
        EB_average_down(pMVar18,pMVar17,scomp,in_stack_fffffffffffffb70,iVar8);
      }
    }
  }
  for (local_334 = 0; local_334 <= *(int *)(in_RDI + 0x54); local_334 = local_334 + 1) {
    if (*(int *)(in_RDI + 0x24) == 1) {
      local_ec._M_weak_count =
           (**(code **)(**(long **)(in_RDI + 0x48) + 0x30))(*(long **)(in_RDI + 0x48),local_334,0);
    }
    Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
    MultiFab::negate((MultiFab *)in_stack_fffffffffffffb50,
                     (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
  }
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~Vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x125eef2);
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~Vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x125eeff);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x125ef0c);
  return;
}

Assistant:

void
MLMG::apply (const Vector<MultiFab*>& out, const Vector<MultiFab*>& a_in)
{
    BL_PROFILE("MLMG::apply()");

    Vector<MultiFab*> in(namrlevs);
    Vector<MultiFab> in_raii(namrlevs);
    Vector<MultiFab> rh(namrlevs);
    int nghost = 0;
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes)
        {
            nghost = linop.getNGrow(alev);
            in[alev] = a_in[alev];
        }
        else if (a_in[alev]->nGrowVect() == ng_sol)
        {
            in[alev] = a_in[alev];
        }
        else
        {
            IntVect ng = ng_sol;
            if (cf_strategy == CFStrategy::ghostnodes) ng = IntVect(nghost);
            in_raii[alev].define(a_in[alev]->boxArray(),
                                 a_in[alev]->DistributionMap(),
                                 a_in[alev]->nComp(), ng,
                                 MFInfo(), *linop.Factory(alev));
            MultiFab::Copy(in_raii[alev], *a_in[alev], 0, 0, a_in[alev]->nComp(), nghost);
            in[alev] = &(in_raii[alev]);
        }
        rh[alev].define(a_in[alev]->boxArray(),
                        a_in[alev]->DistributionMap(),
                        a_in[alev]->nComp(), nghost, MFInfo(),
                        *linop.Factory(alev));
        rh[alev].setVal(0.0);
    }

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();
    }

    for (int alev = 0; alev < namrlevs; ++alev) {
        Any a(MultiFab(rh[alev], amrex::make_alias, 0, rh[alev].nComp()));
        linop.applyInhomogNeumannTerm(alev, a);
    }

    const auto& amrrr = linop.AMRRefRatio();

    for (int alev = finest_amr_lev; alev >= 0; --alev) {
        const MultiFab* crse_bcdata = (alev > 0) ? in[alev-1] : nullptr;
        linop.solutionResidual(alev, *out[alev], *in[alev], rh[alev], crse_bcdata);
        if (alev < finest_amr_lev) {
            linop.reflux(alev, *out[alev], *in[alev], rh[alev],
                         *out[alev+1], *in[alev+1], rh[alev+1]);
            if (linop.isCellCentered()) {
#ifdef AMREX_USE_EB
                amrex::EB_average_down(*out[alev+1], *out[alev], 0, out[alev]->nComp(), amrrr[alev]);
#else
                amrex::average_down(*out[alev+1], *out[alev], 0, out[alev]->nComp(), amrrr[alev]);
#endif
            }
        }
    }

#if (AMREX_SPACEDIM != 3)
    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        linop.unapplyMetricTerm(alev, 0, *out[alev]);
    }
#endif

    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        if (cf_strategy == CFStrategy::ghostnodes)  nghost = linop.getNGrow(alev);
        out[alev]->negate(nghost);
    }
}